

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enums.cpp
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,FENCING_STRATEGY strategy)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  long lVar3;
  long *plVar4;
  initializer_list<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined1 local_d0 [8];
  map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  char *local_98 [2];
  char local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  FENCING_STRATEGY local_28;
  less<FENCING_STRATEGY> local_22;
  allocator_type local_21;
  FENCING_STRATEGY strategy_local;
  
  map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 2;
  local_98[0] = local_88;
  local_28 = strategy;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"LATEST_POSSIBLE","");
  local_78 = 1;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EARLIEST_POSSIBLE","");
  local_50 = 0;
  plVar4 = local_38;
  local_48[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"OMIT_FENCING","");
  __l._M_len = 3;
  __l._M_array = (iterator)&map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_d0,__l,&local_22,&local_21);
  lVar3 = -0x78;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  pmVar2 = std::
           map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_d0,&local_28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar2->_M_string_length);
  std::
  _Rb_tree<FENCING_STRATEGY,_std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<FENCING_STRATEGY,_std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(FENCING_STRATEGY strategy) {
  std::map<FENCING_STRATEGY, std::string> map =
      {
          {FENCING_STRATEGY::LATEST_POSSIBLE, "LATEST_POSSIBLE"},
          {FENCING_STRATEGY::EARLIEST_POSSIBLE, "EARLIEST_POSSIBLE"},
          {FENCING_STRATEGY::OMIT_FENCING, "OMIT_FENCING"}
      };
  return map.at(strategy);
}